

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SecretManager::ThrowTypeNotFoundError(SecretManager *this,string *type,string *secret_path)

{
  size_type sVar1;
  InvalidInputException *this_00;
  DatabaseInstance *db;
  string *in_RCX;
  string error_message;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string entry;
  string local_e0;
  string local_c0 [32];
  string local_a0;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  StringUtil::Lower(&error_message,type);
  ExtensionHelper::FindExtensionInEntries<9ul>
            (&entry,(ExtensionHelper *)&error_message,(string *)&EXTENSION_SECRET_TYPES,
             (ExtensionEntry (*) [9])in_RCX);
  ::std::__cxx11::string::~string((string *)&error_message);
  error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
  error_message._M_string_length = 0;
  error_message.field_2._M_local_buf[0] = '\0';
  if ((entry._M_string_length == 0) || ((this->db).ptr == (DatabaseInstance *)0x0)) {
    ::std::__cxx11::string::string(local_80,"Secret type \'%s\' not found",(allocator *)&local_120);
    ::std::__cxx11::string::string((string *)&local_a0,(string *)type);
    StringUtil::Format<std::__cxx11::string>(&local_140,(StringUtil *)local_80,&local_a0,in_RCX);
    ::std::__cxx11::string::operator=((string *)&error_message,(string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string(local_80);
    sVar1 = secret_path->_M_string_length;
  }
  else {
    ::std::operator+(&local_60,"Secret type \'",type);
    ::std::operator+(&local_40,&local_60,"\' does not exist, but it exists in the ");
    ::std::operator+(&local_120,&local_40,&entry);
    ::std::operator+(&local_140,&local_120," extension.");
    ::std::__cxx11::string::operator=((string *)&error_message,(string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    db = optional_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->db);
    in_RCX = &entry;
    ExtensionHelper::AddExtensionInstallHintToErrorMsg(&local_140,db,&error_message,in_RCX);
    ::std::__cxx11::string::operator=((string *)&error_message,(string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_140);
    sVar1 = secret_path->_M_string_length;
  }
  if (sVar1 != 0) {
    ::std::__cxx11::string::append((char *)&error_message);
  }
  if (secret_path->_M_string_length != 0) {
    ::std::__cxx11::string::string
              (local_c0,"try removing the secret at path \'%s\'.",(allocator *)&local_120);
    ::std::__cxx11::string::string((string *)&local_e0,(string *)secret_path);
    StringUtil::Format<std::__cxx11::string>(&local_140,(StringUtil *)local_c0,&local_e0,in_RCX);
    ::std::__cxx11::string::append((string *)&error_message);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string(local_c0);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&error_message);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SecretManager::ThrowTypeNotFoundError(const string &type, const string &secret_path) {
	auto entry = ExtensionHelper::FindExtensionInEntries(StringUtil::Lower(type), EXTENSION_SECRET_TYPES);
	string error_message;

	if (!entry.empty() && db) {
		error_message = "Secret type '" + type + "' does not exist, but it exists in the " + entry + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(*db, error_message, entry);

		if (!secret_path.empty()) {
			error_message += "\n\nAlternatively, ";
		}
	} else {
		error_message = StringUtil::Format("Secret type '%s' not found", type);

		if (!secret_path.empty()) {
			error_message += ", ";
		}
	}

	if (!secret_path.empty()) {
		error_message += StringUtil::Format("try removing the secret at path '%s'.", secret_path);
	}

	throw InvalidInputException(error_message);
}